

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O1

Am_Value __thiscall Am_Enum_Support::From_String(Am_Enum_Support *this,char *string)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar4;
  char *pcVar5;
  Am_Value AVar6;
  
  iVar1 = *(int *)(string + 0x18);
  if (0 < (long)iVar1) {
    lVar2 = *(long *)(string + 0x10);
    pcVar5 = (char *)0x0;
    do {
      iVar3 = strcmp(in_RDX,*(char **)(lVar2 + (long)pcVar5 * 8));
      if (iVar3 == 0) {
        *(undefined2 *)&(this->super_Am_Type_Support)._vptr_Am_Type_Support =
             *(undefined2 *)(string + 0x1c);
        this->value_string = pcVar5;
        aVar4 = extraout_RDX;
        goto LAB_00223b1c;
      }
      pcVar5 = pcVar5 + 1;
    } while ((char *)(long)iVar1 != pcVar5);
  }
  Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
  aVar4 = extraout_RDX_00;
LAB_00223b1c:
  AVar6.value.wrapper_value = aVar4.wrapper_value;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

Am_Value
Am_Enum_Support::From_String(const char *string) const
{
  int i;
  for (i = 0; i < number; ++i) {
    if (!strcmp(string, item[i]))
      return Am_Value(i, type);
  }
  return Am_No_Value;
}